

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall
cmBoundsCheckerParser::StartElement(cmBoundsCheckerParser *this,string *name,char **atts)

{
  iterator __position;
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  char **ppcVar5;
  ostringstream ostr;
  undefined1 auStack_1d8 [8];
  cmBoundsCheckerParser *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 != 0) goto LAB_001d083b;
      }
      ParseError(this,atts);
      goto LAB_001d083b;
    }
  }
  local_1a8._0_4_ = 0xe;
  __position._M_current =
       (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->Errors,__position,(int *)local_1a8);
  }
  else {
    *__position._M_current = 0xe;
    (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
LAB_001d083b:
  local_1d0 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
  if (*atts != (char *)0x0) {
    ppcVar5 = atts + 2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"   ",3);
      pcVar1 = ppcVar5[-2];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_1d8 +
                        (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                        0x30);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," - ",3);
      pcVar1 = ppcVar5[-1];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_1d8 +
                        (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                        0x30);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pcVar1 = *ppcVar5;
      ppcVar5 = ppcVar5 + 2;
    } while (pcVar1 != (char *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&local_1d0->Log,(ulong)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    if (name == "MemoryLeak" || name == "ResourceLeak") {
      this->Errors.push_back(cmCTestMemCheckHandler::MLK);
    } else if (name == "Error" || name == "Dangling Pointer") {
      this->ParseError(atts);
    }
    // Create the log
    std::ostringstream ostr;
    ostr << name << ":\n";
    int i = 0;
    for (; atts[i] != nullptr; i += 2) {
      ostr << "   " << atts[i] << " - " << atts[i + 1] << "\n";
    }
    ostr << "\n";
    this->Log += ostr.str();
  }